

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

size_t __thiscall PPrototype::PropagateMark(PPrototype *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  PPrototype *this_local;
  
  GC::MarkArray<PType*>(&this->ArgumentTypes);
  GC::MarkArray<PType*>(&this->ReturnTypes);
  uVar1 = TArray<PType_*,_PType_*>::Size(&this->ArgumentTypes);
  uVar2 = TArray<PType_*,_PType_*>::Size(&this->ReturnTypes);
  sVar3 = PType::PropagateMark((PType *)this);
  return (ulong)(uVar1 + uVar2) * 8 + sVar3;
}

Assistant:

size_t PPrototype::PropagateMark()
{
	GC::MarkArray(ArgumentTypes);
	GC::MarkArray(ReturnTypes);
	return (ArgumentTypes.Size() + ReturnTypes.Size()) * sizeof(void*) +
		Super::PropagateMark();
}